

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
cmGeneratorTarget::MaybeGetLocation
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  ImportInfo *pIVar1;
  string local_38;
  
  (__return_storage_ptr__->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  pIVar1 = GetImportInfo(this,config);
  if (pIVar1 == (ImportInfo *)0x0) {
    GetFullPath(&local_38,this,config,RuntimeBinaryArtifact,false);
    std::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)__return_storage_ptr__,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  else if ((pIVar1->Location)._M_string_length != 0) {
    std::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)__return_storage_ptr__,&pIVar1->Location);
  }
  return __return_storage_ptr__;
}

Assistant:

cm::optional<std::string> cmGeneratorTarget::MaybeGetLocation(
  std::string const& config) const
{
  cm::optional<std::string> location;
  if (cmGeneratorTarget::ImportInfo const* imp = this->GetImportInfo(config)) {
    if (!imp->Location.empty()) {
      location = imp->Location;
    }
  } else {
    location = this->GetFullPath(config, cmStateEnums::RuntimeBinaryArtifact);
  }
  return location;
}